

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcFIFO.h
# Opt level: O0

O3DGCErrorCode __thiscall o3dgc::FIFO<long>::Allocate(FIFO<long> *this,unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  unsigned_long size_local;
  FIFO<long> *this_local;
  
  if (size != 0) {
    if (this->m_allocated < size) {
      if (this->m_buffer != (long *)0x0) {
        operator_delete__(this->m_buffer);
      }
      this->m_allocated = size;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->m_allocated;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      plVar3 = (long *)operator_new__(uVar2);
      this->m_buffer = plVar3;
    }
    Clear(this);
    return O3DGC_OK;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcFIFO.h"
                ,0x34,"O3DGCErrorCode o3dgc::FIFO<long>::Allocate(unsigned long) [T = long]");
}

Assistant:

O3DGCErrorCode          Allocate(unsigned long size)
                                {
                                    assert(size > 0);
                                    if (size > m_allocated)
                                    {
                                        delete [] m_buffer;
                                        m_allocated = size;
                                        m_buffer = new T [m_allocated];
                                    }
                                    Clear();
                                    return O3DGC_OK;
                                }